

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O2

DTDEntityDecl * __thiscall xercesc_4_0::DTDGrammar::getEntityDecl(DTDGrammar *this,XMLCh *entName)

{
  DTDEntityDecl *pDVar1;
  
  pDVar1 = NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(fDefaultEntities,entName);
  if (pDVar1 != (DTDEntityDecl *)0x0) {
    return pDVar1;
  }
  pDVar1 = NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(this->fEntityDeclPool,entName);
  return pDVar1;
}

Assistant:

inline DTDEntityDecl* DTDGrammar::getEntityDecl(const XMLCh* const entName)
{
    DTDEntityDecl* decl = fDefaultEntities->getByKey(entName);

    if (!decl)
        return fEntityDeclPool->getByKey(entName);

    return decl;
}